

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Search.h
# Opt level: O0

int sortMoves(moves *moveList,int bestMove)

{
  undefined4 uVar1;
  long lVar2;
  int iVar3;
  undefined8 uStack_50;
  long local_48 [2];
  int tempMove;
  int tempScore;
  int next_move;
  int current_move;
  int i;
  unsigned_long __vla_expr0;
  int local_14;
  moves *pmStack_10;
  int bestMove_local;
  moves *moveList_local;
  
  __vla_expr0 = (unsigned_long)local_48;
  _current_move = (ulong)(uint)moveList->count;
  lVar2 = -(_current_move * 4 + 0xf & 0xfffffffffffffff0);
  local_48[0] = (long)local_48 + lVar2;
  local_14 = bestMove;
  pmStack_10 = moveList;
  for (next_move = 0; next_move < pmStack_10->count; next_move = next_move + 1) {
    if (local_14 == pmStack_10->moves[next_move]) {
      *(undefined4 *)(local_48[0] + (long)next_move * 4) = 30000;
    }
    else {
      iVar3 = pmStack_10->moves[next_move];
      *(undefined8 *)((long)&uStack_50 + lVar2) = 0x10d714;
      iVar3 = scoreMove(iVar3);
      *(int *)(local_48[0] + (long)next_move * 4) = iVar3;
    }
  }
  for (tempScore = 0; tempMove = tempScore, tempScore < pmStack_10->count; tempScore = tempScore + 1
      ) {
    while (tempMove = tempMove + 1, tempMove < pmStack_10->count) {
      if (*(int *)(local_48[0] + (long)tempScore * 4) < *(int *)(local_48[0] + (long)tempMove * 4))
      {
        uVar1 = *(undefined4 *)(local_48[0] + (long)tempScore * 4);
        *(undefined4 *)(local_48[0] + (long)tempScore * 4) =
             *(undefined4 *)(local_48[0] + (long)tempMove * 4);
        *(undefined4 *)(local_48[0] + (long)tempMove * 4) = uVar1;
        iVar3 = pmStack_10->moves[tempScore];
        pmStack_10->moves[tempScore] = pmStack_10->moves[tempMove];
        pmStack_10->moves[tempMove] = iVar3;
      }
    }
  }
  return 1;
}

Assistant:

static inline int sortMoves(moves *moveList,int bestMove) {
    int moveScores[moveList->count];
    for (int i = 0; i < moveList->count; i++) {
        // if best move -> give A LOT of score
        if(bestMove == moveList->moves[i]){
            moveScores[i] = 30000;
        }
        else{
            // for each move, calculate score
            moveScores[i] = scoreMove(moveList->moves[i]);
        }
    }


    // bubble sort according to score. bigger score first, smaller score last
    for (int current_move = 0; current_move < moveList->count; current_move++) {
        for (int next_move = current_move + 1; next_move < moveList->count; next_move++) {

            if (moveScores[current_move] < moveScores[next_move]) {
                // swap scores
                int tempScore = moveScores[current_move];
                moveScores[current_move] = moveScores[next_move];
                moveScores[next_move] = tempScore;

                // swap moves
                int tempMove = moveList->moves[current_move];
                moveList->moves[current_move] = moveList->moves[next_move];
                moveList->moves[next_move] = tempMove;
            }
        }
    }
    return 1;
}